

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O2

void soplex::LPFwriteRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *p_lp,ostream *p_output,NameSet *p_cnames,
                        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *p_svec,Rational *p_lhs,Rational *p_rhs,SPxOut *spxout)

{
  bool bVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ostream *os;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  *this;
  char *pcVar5;
  double dVar6;
  Verbosity old_verbosity;
  string local_50;
  
  lVar2 = std::ostream::tellp();
  LPFwriteSVector(p_lp,p_output,p_cnames,p_svec,spxout,false);
  bVar1 = boost::multiprecision::default_ops::
          eval_eq<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                    (&p_lhs->m_backend,&p_rhs->m_backend);
  if (!bVar1) {
    dVar6 = boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::convert_to<double>(p_lhs);
    pdVar3 = (double *)infinity();
    this = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            *)p_lhs;
    if (-*pdVar3 < dVar6) goto LAB_0012b65b;
  }
  this = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
          *)p_rhs;
LAB_0012b65b:
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::str_abi_cxx11_(&local_50,this,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
  std::__cxx11::string::~string((string *)&local_50);
  lVar4 = std::ostream::tellp();
  if (0xff9c < (long)((local_50._M_string_length - lVar2) + lVar4)) {
    std::operator<<(p_output,"\n\t");
    lVar4 = std::ostream::tellp();
    if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar4 - lVar2)) && (0 < (int)spxout->m_verbosity))
    {
      local_50._M_dataplus._M_p._0_4_ = spxout->m_verbosity;
      (*spxout->_vptr_SPxOut[2])(spxout);
      operator<<(spxout,
                 "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
                );
      (*spxout->_vptr_SPxOut[2])(spxout,&local_50);
    }
    lVar2 = std::ostream::tellp();
  }
  bVar1 = boost::multiprecision::default_ops::
          eval_eq<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                    (&p_lhs->m_backend,&p_rhs->m_backend);
  if (bVar1) {
    pcVar5 = " = ";
  }
  else {
    dVar6 = boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::convert_to<double>(p_lhs);
    pdVar3 = (double *)infinity();
    pcVar5 = " <= ";
    if (-*pdVar3 < dVar6) {
      pcVar5 = " >= ";
      p_rhs = p_lhs;
    }
  }
  os = std::operator<<(p_output,pcVar5);
  boost::multiprecision::operator<<(os,p_rhs);
  std::operator<<(p_output,"\n");
  lVar4 = std::ostream::tellp();
  if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar4 - lVar2)) &&
     (local_50._M_dataplus._M_p._0_4_ = spxout->m_verbosity,
     0 < (int)(Verbosity)local_50._M_dataplus._M_p)) {
    (*spxout->_vptr_SPxOut[2])(spxout);
    operator<<(spxout,
               "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
              );
    (*spxout->_vptr_SPxOut[2])(spxout,&local_50);
  }
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<Rational>&   p_lp,       ///< the LP
   std::ostream&            p_output,   ///< output stream
   const NameSet*           p_cnames,   ///< column names
   const SVectorBase<Rational>& p_svec,     ///< vector of the row
   const Rational&              p_lhs,      ///< lhs of the row
   const Rational&              p_rhs,      ///< rhs of the row
   SPxOut*                      spxout      ///< out stream
)
{

   long long pos;
   pos = p_output.tellp();

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec, spxout);

   long long sidelen;
   sidelen = (p_lhs == p_rhs
              || double(p_lhs) <= double(-infinity)) ? (long long)p_rhs.str().length()
             : (long long)p_lhs.str().length();

   // insert a line break if max line length is in danger of being exceeded
   if((long long)(p_output.tellp()) - pos + sidelen + (long long)100 > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      p_output << "\n\t";

      if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) <<
                         "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
      }

      pos = p_output.tellp();
   }

   // write bound value
   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(double(p_lhs) <= double(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(double(p_rhs) >= double(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";

   if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
   }
}